

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O2

Sfm_Lib_t * Sfm_LibPrepare(int nVars,int fTwo,int fDelay,int fVerbose,int fLibVerbose)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  abctime aVar5;
  Sfm_Lib_t *p;
  Mio_Cell2_t *pMVar6;
  Mio_Cell2_t *pMVar7;
  word wVar8;
  ulong uVar9;
  long lVar10;
  int *piVar11;
  ulong uVar12;
  abctime aVar13;
  uint uVar14;
  word *pwVar15;
  Mio_Cell2_t *pCellTop;
  long lVar16;
  word tCur [4];
  word tTemp1 [4];
  int Perm [8];
  int *pPerm [9];
  int nPerms [9];
  char pRes [1000];
  
  aVar5 = Abc_Clock();
  p = Sfm_LibStart(nVars,fDelay,fLibVerbose);
  if (8 < nVars) {
    __assert_fail("nVars <= SFM_SUPP_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmLib.c"
                  ,0x1b2,"Sfm_Lib_t *Sfm_LibPrepare(int, int, int, int, int)");
  }
  iVar3 = 6;
  if (nVars < 6) {
    iVar3 = nVars;
  }
  pMVar6 = Mio_CollectRootsNewDefault2(iVar3,&p->nCells,0);
  p->pCells = pMVar6;
  pMVar7 = pMVar6 + p->nCells;
  for (pMVar6 = pMVar6 + 4; pMVar6 < pMVar7; pMVar6 = pMVar6 + 1) {
    piVar11 = (int *)pMVar6->uTruth;
    uVar2 = *(uint *)&pMVar6->field_0x10;
    *(uint *)&pMVar6->field_0x10 = uVar2 & 0xf3ffffff;
    pPerm[0] = piVar11;
    wVar8 = Abc_Tt6Mask(1 << (byte)(uVar2 >> 0x1c));
    uVar9 = wVar8 & (ulong)piVar11;
    uVar12 = uVar9 - 1;
    if (uVar12 < (uVar9 ^ uVar12)) {
LAB_00409277:
      uVar2 = *(uint *)&pMVar6->field_0x10 & 0xf3ffffff | 0x4000000;
LAB_00409283:
      *(uint *)&pMVar6->field_0x10 = uVar2;
    }
    else {
      uVar9 = ~(ulong)pPerm[0];
      wVar8 = Abc_Tt6Mask(1 << (byte)((uint)*(undefined4 *)&pMVar6->field_0x10 >> 0x1c));
      uVar12 = (wVar8 & uVar9) - 1;
      if (uVar12 < (wVar8 & uVar9 ^ uVar12)) goto LAB_00409277;
      iVar3 = Dau_DsdDecompose((word *)pPerm,*(uint *)&pMVar6->field_0x10 >> 0x1c,0,0,pRes);
      if (iVar3 < 4) {
        uVar2 = *(uint *)&pMVar6->field_0x10 & 0xf3ffffff | 0x8000000;
        goto LAB_00409283;
      }
      if (fLibVerbose != 0) {
        printf("Skipping gate \"%s\" with non-DSD function %s\n",pMVar6->pName,pRes);
      }
    }
  }
  lVar10 = (long)nVars;
  for (lVar16 = 2; lVar16 <= lVar10; lVar16 = lVar16 + 1) {
    piVar11 = Extra_PermSchedule((int)lVar16);
    pPerm[lVar16] = piVar11;
  }
  for (lVar16 = 2; lVar16 <= lVar10; lVar16 = lVar16 + 1) {
    iVar3 = Extra_Factorial((int)lVar16);
    nPerms[lVar16] = iVar3;
  }
  pMVar6 = p->pCells + 4;
  do {
    if (pMVar7 <= pMVar6) {
      if (fTwo != 0) {
        for (pMVar6 = p->pCells + 4; pMVar6 < pMVar7; pMVar6 = pMVar6 + 1) {
          if ((pMVar6->field_0x13 & 0xc) != 0) {
            for (pCellTop = p->pCells + 4; pCellTop < pMVar7; pCellTop = pCellTop + 1) {
              if (((*(uint *)&pCellTop->field_0x10 & 0xc000000) != 0) &&
                 ((int)((*(uint *)&pCellTop->field_0x10 >> 0x1c) +
                       (*(uint *)&pMVar6->field_0x10 >> 0x1c)) <= nVars + 1)) {
                uVar2 = 0;
                while( true ) {
                  uVar4 = *(uint *)&pCellTop->field_0x10 >> 0x1c;
                  if (uVar4 <= uVar2) break;
                  uVar14 = *(uint *)&pMVar6->field_0x10 >> 0x1c;
                  uVar1 = uVar14 + uVar4;
                  if ((uVar1 < 3) || (uVar4 = (uVar14 + uVar4) - 1, nVars < (int)uVar4)) {
                    __assert_fail("nFanins >= 2 && nFanins <= nVars",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmLib.c"
                                  ,0x1e7,"Sfm_Lib_t *Sfm_LibPrepare(int, int, int, int, int)");
                  }
                  uVar9 = (ulong)uVar4;
                  for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
                    Perm[uVar12] = (int)uVar12;
                  }
                  if (p->nVars < 7) {
                    tCur[0] = Sfm_LibTruth6Two(pMVar6,pCellTop,uVar2);
                    tTemp1[0] = tCur[0];
                  }
                  else {
                    pwVar15 = tCur;
                    Sfm_LibTruth8Two(pMVar6,pCellTop,uVar2,tCur);
                    Abc_TtCopy(tTemp1,tCur,p->nWords,(int)pwVar15);
                  }
                  uVar14 = nPerms[uVar9];
                  if (nPerms[uVar9] < 1) {
                    uVar14 = 0;
                  }
                  for (uVar12 = 0; uVar14 != uVar12; uVar12 = uVar12 + 1) {
                    Sfm_LibPrepareAdd(p,tCur,Perm,uVar4,pMVar6,pCellTop,uVar2);
                    iVar3 = p->nWords;
                    if (6 < uVar1) goto LAB_004095f9;
                    piVar11 = pPerm[uVar9];
                    Abc_TtSwapAdjacent(tCur,iVar3,piVar11[uVar12]);
                    iVar3 = piVar11[uVar12];
                    *(ulong *)(Perm + iVar3) =
                         CONCAT44((int)*(undefined8 *)(Perm + iVar3),
                                  (int)((ulong)*(undefined8 *)(Perm + iVar3) >> 0x20));
                  }
                  iVar3 = p->nWords;
LAB_004095f9:
                  iVar3 = Abc_TtEqual(tTemp1,tCur,iVar3);
                  uVar2 = uVar2 + 1;
                  if (iVar3 == 0) {
                    __assert_fail("Abc_TtEqual(tTemp1, tCur, p->nWords)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmLib.c"
                                  ,0x1fd,"Sfm_Lib_t *Sfm_LibPrepare(int, int, int, int, int)");
                  }
                }
              }
            }
          }
        }
      }
      for (lVar16 = 2; lVar16 <= lVar10; lVar16 = lVar16 + 1) {
        if (pPerm[lVar16] != (int *)0x0) {
          free(pPerm[lVar16]);
          pPerm[lVar16] = (int *)0x0;
        }
      }
      if (fVerbose != 0) {
        uVar2 = p->vTtMem->nEntries - 2;
        uVar4 = p->nObjs - p->nObjRemoved;
        iVar3 = 0x719bf5;
        printf("Library processing: Var = %d. Cell = %d.  Fun = %d. Obj = %d. Ave = %.2f.  Skip = %d. Rem = %d.  "
               ,(double)(int)uVar4 / (double)(int)uVar2,(ulong)(uint)nVars,(ulong)(uint)p->nCells,
               (ulong)uVar2,(ulong)uVar4,(ulong)(uint)p->nObjSkipped,p->nObjRemoved);
        aVar13 = Abc_Clock();
        Abc_Print(iVar3,"%s =","Time");
        Abc_Print(iVar3,"%9.2f sec\n",(double)(aVar13 - aVar5) / 1000000.0);
      }
      return p;
    }
    if (*(uint *)&pMVar6->field_0x10 < 0x20000000) {
LAB_00409749:
      __assert_fail("nFanins >= 2 && nFanins <= nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmLib.c"
                    ,0x1cb,"Sfm_Lib_t *Sfm_LibPrepare(int, int, int, int, int)");
    }
    uVar2 = *(uint *)&pMVar6->field_0x10 >> 0x1c;
    uVar12 = (ulong)uVar2;
    if (nVars < (int)uVar2) goto LAB_00409749;
    for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
      Perm[uVar9] = (int)uVar9;
    }
    tCur[0] = pMVar6->uTruth;
    if (6 < p->nVars) {
      tCur[1] = tCur[0];
      tCur[2] = tCur[0];
      tCur[3] = tCur[0];
      tTemp1[1] = tCur[0];
      tTemp1[2] = tCur[0];
      tTemp1[3] = tCur[0];
    }
    uVar4 = nPerms[uVar12];
    if (nPerms[uVar12] < 1) {
      uVar4 = 0;
    }
    tTemp1[0] = tCur[0];
    for (uVar9 = 0; uVar4 != uVar9; uVar9 = uVar9 + 1) {
      Sfm_LibPrepareAdd(p,tCur,Perm,uVar2,pMVar6,(Mio_Cell2_t *)0x0,-1);
      piVar11 = pPerm[uVar12];
      Abc_TtSwapAdjacent(tCur,p->nWords,piVar11[uVar9]);
      iVar3 = piVar11[uVar9];
      *(ulong *)(Perm + iVar3) =
           CONCAT44((int)*(undefined8 *)(Perm + iVar3),
                    (int)((ulong)*(undefined8 *)(Perm + iVar3) >> 0x20));
    }
    iVar3 = Abc_TtEqual(tTemp1,tCur,p->nWords);
    pMVar6 = pMVar6 + 1;
    if (iVar3 == 0) {
      __assert_fail("Abc_TtEqual(tTemp1, tCur, p->nWords)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmLib.c"
                    ,0x1db,"Sfm_Lib_t *Sfm_LibPrepare(int, int, int, int, int)");
    }
  } while( true );
}

Assistant:

Sfm_Lib_t * Sfm_LibPrepare( int nVars, int fTwo, int fDelay, int fVerbose, int fLibVerbose )
{
    abctime clk = Abc_Clock();
    Sfm_Lib_t * p = Sfm_LibStart( nVars, fDelay, fLibVerbose );
    Mio_Cell2_t * pCell1, * pCell2, * pLimit;
    int * pPerm[SFM_SUPP_MAX+1], * Perm1, * Perm2, Perm[SFM_SUPP_MAX];
    int nPerms[SFM_SUPP_MAX+1], i, f, n;
    word tTemp1[4], tCur[4];
    char pRes[1000];
    assert( nVars <= SFM_SUPP_MAX );
    // precompute gates
    p->pCells = Mio_CollectRootsNewDefault2( Abc_MinInt(6, nVars), &p->nCells, 0 );
    pLimit = p->pCells + p->nCells;
    // find useful ones
    for ( pCell1 = p->pCells + 4; pCell1 < pLimit; pCell1++ )
    {
        word uTruth = pCell1->uTruth;
        pCell1->Type = 0;
        if ( Abc_Tt6IsAndType(uTruth, pCell1->nFanins) || Abc_Tt6IsOrType(uTruth, pCell1->nFanins) )
            pCell1->Type = 1;
        else if ( Dau_DsdDecompose(&uTruth, pCell1->nFanins, 0, 0, pRes) <= 3 )
            pCell1->Type = 2;
        else if ( fLibVerbose )
            printf( "Skipping gate \"%s\" with non-DSD function %s\n", pCell1->pName, pRes );
    }
    // generate permutations
    for ( i = 2; i <= nVars; i++ )
        pPerm[i] = Extra_PermSchedule( i );
    for ( i = 2; i <= nVars; i++ )
        nPerms[i] = Extra_Factorial( i );
    // add single cells
    for ( pCell1 = p->pCells + 4; pCell1 < pLimit; pCell1++ ) 
    {
        int nFanins = pCell1->nFanins;
        assert( nFanins >= 2 && nFanins <= nVars );
        for ( i = 0; i < nFanins; i++ )
            Perm[i] = i;
        // permute truth table
        tCur[0] = tTemp1[0] = pCell1->uTruth;
        if ( p->nVars > 6 )
            tTemp1[1] = tTemp1[2] = tTemp1[3] = tCur[1] = tCur[2] = tCur[3] = tCur[0];
        for ( n = 0; n < nPerms[nFanins]; n++ )
        {
            Sfm_LibPrepareAdd( p, tCur, Perm, nFanins, pCell1, NULL, -1 );
            // update
            Abc_TtSwapAdjacent( tCur, p->nWords, pPerm[nFanins][n] );
            Perm1 = Perm + pPerm[nFanins][n];
            Perm2 = Perm1 + 1;
            ABC_SWAP( int, *Perm1, *Perm2 );
        }
        assert( Abc_TtEqual(tTemp1, tCur, p->nWords) );
    }
    // add double cells
    if ( fTwo )
    for ( pCell1 = p->pCells + 4; pCell1 < pLimit; pCell1++ ) // Bot
    if ( pCell1->Type > 0 )
    for ( pCell2 = p->pCells + 4; pCell2 < pLimit; pCell2++ ) // Top
    if ( pCell2->Type > 0 )//&& pCell1->Type + pCell2->Type <= 2 )
    if ( (int)pCell1->nFanins + (int)pCell2->nFanins <= nVars + 1 )
    for ( f = 0; f < (int)pCell2->nFanins; f++ )
    {
        int nFanins = pCell1->nFanins + pCell2->nFanins - 1;
        assert( nFanins >= 2 && nFanins <= nVars );
        for ( i = 0; i < nFanins; i++ )
            Perm[i] = i;
        // permute truth table
        if ( p->nVars > 6 )
        {
            Sfm_LibTruth8Two( pCell1, pCell2, f, tCur );
            Abc_TtCopy( tTemp1, tCur, p->nWords, 0 );
        }
        else
            tCur[0] = tTemp1[0] = Sfm_LibTruth6Two( pCell1, pCell2, f );
        for ( n = 0; n < nPerms[nFanins]; n++ )
        {
            Sfm_LibPrepareAdd( p, tCur, Perm, nFanins, pCell1, pCell2, f );
            if ( nFanins > 5 )
                break;
            // update
            Abc_TtSwapAdjacent( tCur, p->nWords, pPerm[nFanins][n] );
            Perm1 = Perm + pPerm[nFanins][n];
            Perm2 = Perm1 + 1;
            ABC_SWAP( int, *Perm1, *Perm2 );
        }
        assert( Abc_TtEqual(tTemp1, tCur, p->nWords) );
    }
    // cleanup
    for ( i = 2; i <= nVars; i++ )
        ABC_FREE( pPerm[i] );
    if ( fVerbose )
    {
        printf( "Library processing: Var = %d. Cell = %d.  Fun = %d. Obj = %d. Ave = %.2f.  Skip = %d. Rem = %d.  ", 
            nVars, p->nCells, Vec_MemEntryNum(p->vTtMem)-2, 
            p->nObjs-p->nObjRemoved, 1.0*(p->nObjs-p->nObjRemoved)/(Vec_MemEntryNum(p->vTtMem)-2), 
            p->nObjSkipped, p->nObjRemoved );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    return p;
}